

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
OP_GetRootProperty<Js::OpLayoutT_ElementRootCP<Js::LayoutSizePolicy<(Js::LayoutSize)2>>const__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementRootCP<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout)

{
  uint uVar1;
  code *pcVar2;
  undefined8 object;
  bool bVar3;
  uint uVar4;
  PropertyId propertyId_00;
  undefined4 *puVar5;
  Var aValue;
  InlineCache *inlineCache_00;
  FunctionBody *functionBody;
  ScriptContext *requestContext;
  Var local_80;
  Var value;
  PropertyValueInfo info;
  DynamicObject *obj;
  PropertyId propertyId;
  InlineCache *inlineCache;
  Var instance;
  OpLayoutT_ElementRootCP<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout_local;
  InterpreterStackFrame *this_local;
  
  uVar1 = playout->inlineCacheIndex;
  uVar4 = FunctionBody::GetRootObjectLoadInlineCacheStart(*(FunctionBody **)(this + 0x88));
  if (uVar1 < uVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0xfe2,
                                "(playout->inlineCacheIndex >= this->m_functionBody->GetRootObjectLoadInlineCacheStart())"
                                ,
                                "playout->inlineCacheIndex >= this->m_functionBody->GetRootObjectLoadInlineCacheStart()"
                               );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  aValue = GetRootObject(this);
  inlineCache_00 = GetInlineCache(this,playout->inlineCacheIndex);
  propertyId_00 = GetPropertyIdFromCacheId(this,playout->inlineCacheIndex);
  info._56_8_ = UnsafeVarTo<Js::DynamicObject>(aValue);
  PropertyValueInfo::PropertyValueInfo((PropertyValueInfo *)&value);
  functionBody = GetFunctionBody(this);
  PropertyValueInfo::SetCacheInfo
            ((PropertyValueInfo *)&value,functionBody,inlineCache_00,playout->inlineCacheIndex,true)
  ;
  object = info._56_8_;
  requestContext = GetScriptContext(this);
  bVar3 = CacheOperators::TryGetProperty<true,false,false,false,false,false,true,false,false,false>
                    ((Var)object,true,(RecyclableObject *)object,propertyId_00,&local_80,
                     requestContext,(PropertyCacheOperationInfo *)0x0,(PropertyValueInfo *)&value);
  if (bVar3) {
    SetReg<unsigned_int>(this,playout->Value,local_80);
  }
  else {
    OP_GetRootProperty_NoFastPath<Js::OpLayoutT_ElementRootCP<Js::LayoutSizePolicy<(Js::LayoutSize)2>>const__unaligned>
              (this,playout);
  }
  return;
}

Assistant:

void InterpreterStackFrame::OP_GetRootProperty(unaligned T* playout)
    {
        // Same fast path as in the backend.
        Assert(playout->inlineCacheIndex >= this->m_functionBody->GetRootObjectLoadInlineCacheStart());
        Js::Var instance = this->GetRootObject();

        InlineCache *inlineCache = this->GetInlineCache(playout->inlineCacheIndex);

        PropertyId propertyId = GetPropertyIdFromCacheId(playout->inlineCacheIndex);
        DynamicObject * obj = UnsafeVarTo<DynamicObject>(instance);

        PropertyValueInfo info;
        PropertyValueInfo::SetCacheInfo(&info, GetFunctionBody(), inlineCache, playout->inlineCacheIndex, true);
        Var value;
        if (CacheOperators::TryGetProperty<true, false, false, false, false, false, true, false, false, false>(
            obj, true, obj, propertyId, &value, GetScriptContext(), nullptr, &info))
        {
            SetReg(playout->Value, value);
            return;
        }

        OP_GetRootProperty_NoFastPath(playout);
    }